

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O2

int run_test_loop_instant_close(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = uv_loop_init(&run_test_loop_instant_close::loop);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                          loop_instant_close_work_cb,loop_instant_close_after_work_cb);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      eval_a = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "uv_loop_close(uv_default_loop())";
      pcVar3 = "0";
      uVar2 = 0x4b;
    }
    else {
      pcVar4 = "0";
      pcVar3 = 
      "uv_queue_work(&loop, &req, loop_instant_close_work_cb, loop_instant_close_after_work_cb)";
      uVar2 = 0x4a;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_loop_init(&loop)";
    uVar2 = 0x46;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(loop_instant_close) {
  static uv_loop_t loop;
  static uv_work_t req;
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_queue_work(&loop,
                          &req,
                          loop_instant_close_work_cb,
                          loop_instant_close_after_work_cb));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}